

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplicationDifferentiationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  double dVar2;
  Expression expression;
  Variable y;
  Variable x;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  Variable *in_stack_fffffffffffffd60;
  allocator *paVar3;
  Expression *in_stack_fffffffffffffd68;
  allocator local_229;
  string local_228 [63];
  allocator local_1e9;
  string local_1e8 [56];
  Expression *in_stack_fffffffffffffe50;
  Variable *in_stack_fffffffffffffe58;
  allocator local_171;
  string local_170 [60];
  undefined4 local_134;
  allocator local_f9;
  string local_f8 [87];
  allocator local_a1;
  string local_a0 [156];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x11540e);
  Kandinsky::Variable::Variable((Variable *)0x11541b);
  Kandinsky::Variable::setValue
            (in_stack_fffffffffffffd60,
             (double)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  Kandinsky::Variable::setValue
            (in_stack_fffffffffffffd60,
             (double)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffe58,(Variable *)in_stack_fffffffffffffe50);
  Kandinsky::Expression::differentiate(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  Kandinsky::Expression::evaluate((Expression *)0x115496);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"d(x * y)/dx != 2",&local_a1);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  Kandinsky::Expression::~Expression((Expression *)0x11552a);
  Kandinsky::Expression::~Expression((Expression *)0x115537);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffe58,(Variable *)in_stack_fffffffffffffe50);
  Kandinsky::Expression::differentiate(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  Kandinsky::Expression::evaluate((Expression *)0x115582);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"d(x * y)/dy != 3",&local_f9);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  Kandinsky::Expression::~Expression((Expression *)0x115616);
  Kandinsky::Expression::~Expression((Expression *)0x115623);
  local_134 = 4;
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffe58,(Variable *)in_stack_fffffffffffffe50);
  Kandinsky::operator*<int,_Kandinsky::Expression,_nullptr>
            ((int *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Kandinsky::Expression::differentiate(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  Kandinsky::Expression::evaluate((Expression *)0x115698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"y = 2; d(4 * (x * y))/dx != 8",&local_171);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  Kandinsky::Expression::~Expression((Expression *)0x11572c);
  Kandinsky::Expression::~Expression((Expression *)0x115739);
  Kandinsky::Expression::~Expression((Expression *)0x115746);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffe58,(Variable *)in_stack_fffffffffffffe50);
  Kandinsky::operator*<int,_Kandinsky::Expression,_nullptr>
            ((int *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Kandinsky::Expression::~Expression((Expression *)0x11579c);
  Kandinsky::Expression::differentiate(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  Kandinsky::Expression::evaluate((Expression *)0x1157c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"x = 3; d(4 * (x * y))/dy != 12",&local_1e9);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  Kandinsky::Expression::~Expression((Expression *)0x11585c);
  Kandinsky::Variable::setValue
            (in_stack_fffffffffffffd60,
             (double)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  Kandinsky::Expression::differentiate(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  dVar2 = Kandinsky::Expression::evaluate((Expression *)0x11589f);
  bVar1 = -(dVar2 == 20.0) & 1;
  paVar3 = &local_229;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"x = 5; d(4 * (x * y))/dy != 20",paVar3);
  Kandinsky::assertOrExit
            (SUB81((ulong)paVar3 >> 0x38,0),(string *)CONCAT17(bVar1,in_stack_fffffffffffffd58));
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  Kandinsky::Expression::~Expression((Expression *)0x11592d);
  local_4 = 0;
  Kandinsky::Expression::~Expression((Expression *)0x115945);
  Kandinsky::Variable::~Variable((Variable *)0x115952);
  Kandinsky::Variable::~Variable((Variable *)0x11595f);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x * y).differentiate(x).evaluate() == 2, "d(x * y)/dx != 2");
    assertOrExit((x * y).differentiate(y).evaluate() == 3, "d(x * y)/dy != 3");
    assertOrExit((4 * (x * y)).differentiate(x).evaluate() == 8, "y = 2; d(4 * (x * y))/dx != 8");
    Expression expression(4 * (x * y));
    assertOrExit(expression.differentiate(y).evaluate() == 12, "x = 3; d(4 * (x * y))/dy != 12");
    x.setValue(5);
    assertOrExit(expression.differentiate(y).evaluate() == 20, "x = 5; d(4 * (x * y))/dy != 20");
    return 0;
}